

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void warning(c2m_ctx_t c2m_ctx,pos_t pos,char *format,...)

{
  FILE *__s;
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  __s = (FILE *)c2m_ctx->options->message_file;
  if ((__s != (FILE *)0x0) &&
     (c2m_ctx->n_warnings = c2m_ctx->n_warnings + 1, c2m_ctx->options->ignore_warnings_p == 0)) {
    local_d8 = local_c8;
    local_e0 = &args[0].overflow_arg_area;
    local_e8 = 0x3000000020;
    local_a8 = in_R8;
    local_a0 = in_R9;
    print_pos((FILE *)__s,pos,1);
    fwrite("warning -- ",0xb,1,__s);
    vfprintf(__s,format,&local_e8);
    fputc(10,__s);
  }
  return;
}

Assistant:

static void warning (c2m_ctx_t c2m_ctx, pos_t pos, const char *format, ...) {
  va_list args;
  FILE *f;

  if ((f = c2m_options->message_file) == NULL) return;
  n_warnings++;
  if (!c2m_options->ignore_warnings_p) {
    va_start (args, format);
    print_pos (f, pos, TRUE);
    fprintf (f, "warning -- ");
    vfprintf (f, format, args);
    va_end (args);
    fprintf (f, "\n");
  }
}